

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consoleOutput.cpp
# Opt level: O2

outputArrow * __thiscall
consoleOutput::initArrow(consoleOutput *this,int8_t nodeIndex,int8_t arrowIndex)

{
  string *psVar1;
  WINDOW *pWVar2;
  arrowType *paVar3;
  outputArrow *this_00;
  string *label;
  int arrowIndex_00;
  int iVar4;
  undefined7 in_register_00000031;
  int iVar5;
  int iVar6;
  arrowType *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar4 = (int)CONCAT71(in_register_00000031,nodeIndex);
  pWVar2 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar4].w_main;
  if (pWVar2 == (WINDOW *)0x0) {
    iVar6 = -1;
    iVar5 = iVar6;
  }
  else {
    iVar6 = (int)pWVar2->_begx;
    iVar5 = (int)pWVar2->_begy;
  }
  arrowIndex_00 = (int)arrowIndex;
  this_00 = (outputArrow *)operator_new(0x20);
  psVar1 = &(this->super_output).lbl;
  if (arrowIndex_00 == 2) {
    label = &local_90;
    std::__cxx11::string::string((string *)label,(string *)psVar1);
    outputArrow::outputArrow(this_00,nodeIndex,iVar5 + 0xb,iVar6 + 7,2,label);
  }
  else if (arrowIndex_00 == 1) {
    label = &local_70;
    std::__cxx11::string::string((string *)label,(string *)psVar1);
    outputArrow::outputArrow(this_00,nodeIndex,iVar5 + 3,iVar6 + 0x1b,1,label);
  }
  else if (arrowIndex == '\0') {
    label = &local_50;
    std::__cxx11::string::string((string *)label,(string *)psVar1);
    outputArrow::outputArrow(this_00,nodeIndex,iVar5 + -1,iVar6 + 7,0,label);
  }
  else {
    label = &local_b0;
    std::__cxx11::string::string((string *)label,(string *)psVar1);
    outputArrow::outputArrow(this_00,nodeIndex,iVar5 + 3,iVar6 + -4,arrowIndex_00,label);
  }
  (this->super_output).outArr = this_00;
  std::__cxx11::string::~string((string *)label);
  local_b8 = &((this->super_output).outArr)->super_arrowType;
  std::vector<arrowType*,std::allocator<arrowType*>>::emplace_back<arrowType*>
            ((vector<arrowType*,std::allocator<arrowType*>> *)&gridArrows,&local_b8);
  paVar3 = &((this->super_output).outArr)->super_arrowType;
  grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data._M_start
  [iVar4].arrows[arrowIndex] = paVar3;
  wrefresh(paVar3->win);
  return (this->super_output).outArr;
}

Assistant:

outputArrow *consoleOutput::initArrow(int8_t nodeIndex, int8_t arrowIndex) {
	int y, x;
	getbegyx(grid[nodeIndex].w_main, y, x);

	if (arrowIndex == 0)
		outArr = new outputArrow(nodeIndex, y - ARROW_V_HEIGHT, x + floor(NODE_WIDTH / 2) - floor(ARROW_V_WIDTH / 2), arrowIndex, lbl);
	else if (arrowIndex == 1)
		outArr = new outputArrow(nodeIndex, y + floor(NODE_HEIGHT / 2) - floor(ARROW_H_HEIGHT / 2), x + NODE_WIDTH + GAP_WIDTH_H, arrowIndex, lbl);
	else if (arrowIndex == 2)
		outArr = new outputArrow(nodeIndex, y + NODE_HEIGHT + GAP_WIDTH_V, x + floor(NODE_WIDTH / 2) - floor(ARROW_V_WIDTH / 2), arrowIndex, lbl);
	else
		outArr = new outputArrow(nodeIndex, y + floor(NODE_HEIGHT / 2) - floor(ARROW_H_HEIGHT / 2), x - ARROW_H_WIDTH, arrowIndex, lbl);

	gridArrows.push_back(outArr);
	grid[nodeIndex].arrows[arrowIndex] = outArr;

	wrefresh(outArr->win);

	return outArr;
}